

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strife_sbar.cpp
# Opt level: O0

void __thiscall DStrifeStatusBar::Tick(DStrifeStatusBar *this)

{
  DStrifeStatusBar *this_local;
  
  DBaseStatusBar::Tick(&this->super_DBaseStatusBar);
  if ((0.0 < this->ItemFlash) &&
     (this->ItemFlash = this->ItemFlash - 0.07142857142857142,
     this->ItemFlash <= 0.0 && this->ItemFlash != 0.0)) {
    this->ItemFlash = 0.0;
  }
  this->PopHeightChange = 0;
  if (this->PendingPop == -1) {
    if (this->CurrentPop == 0) {
      this->PopHeight = 0;
    }
    else if (-0x68 < this->PopHeight) {
      this->PopHeight = this->PopHeight + -0x1a;
      if (this->PopHeight < -0x68) {
        this->PopHeight = -0x68;
      }
      else {
        this->PopHeightChange = -0x1a;
      }
    }
    if ((0 < this->KeyPopScroll) &&
       (this->KeyPopScroll = this->KeyPopScroll + -0x19, this->KeyPopScroll < 0)) {
      this->KeyPopScroll = 0;
    }
  }
  else if (this->PopHeight < 0) {
    this->PopHeightChange = 0x1a;
    this->PopHeight = this->PopHeight + 0x1a;
  }
  else {
    this->CurrentPop = this->PendingPop;
    this->PendingPop = -1;
  }
  return;
}

Assistant:

void Tick ()
	{
		DBaseStatusBar::Tick ();

		if (ItemFlash > 0)
		{
			ItemFlash -= 1/14.;
			if (ItemFlash < 0)
			{
				ItemFlash = 0;
			}
		}

		PopHeightChange = 0;
		if (PendingPop != POP_NoChange)
		{
			if (PopHeight < 0)
			{
				PopHeightChange = POP_HEIGHT / POP_TIME;
				PopHeight += POP_HEIGHT / POP_TIME;
			}
			else
			{
				CurrentPop = PendingPop;
				PendingPop = POP_NoChange;
			}
		}
		else
		{
			if (CurrentPop == POP_None)
			{
				PopHeight = 0;
			}
			else if (PopHeight > -POP_HEIGHT)
			{
				PopHeight -= POP_HEIGHT / POP_TIME;
				if (PopHeight < -POP_HEIGHT)
				{
					PopHeight = -POP_HEIGHT;
				}
				else
				{
					PopHeightChange = -POP_HEIGHT / POP_TIME;
				}
			}
			if (KeyPopScroll > 0)
			{
				KeyPopScroll -= 280 / KEY_TIME;
				if (KeyPopScroll < 0)
				{
					KeyPopScroll = 0;
				}
			}
		}
	}